

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding2.c
# Opt level: O0

BOOL objc_layout_structure_next_member(objc_struct_layout *layout)

{
  char *local_20;
  char *type;
  char *end;
  objc_struct_layout *layout_local;
  
  type = layout->type;
  layout->record_size = 0;
  layout->record_align = 0;
  layout->prev_type = layout->type;
  local_20 = layout->original_type;
  end = (char *)layout;
  parse_struct(&local_20,layout_structure_callback,layout);
  return *(char **)(end + 8) != type;
}

Assistant:

OBJC_PUBLIC
BOOL objc_layout_structure_next_member(struct objc_struct_layout *layout)
{
	const char *end = layout->type;
	layout->record_size = 0;
	layout->record_align = 0;
	layout->prev_type = layout->type;
	const char *type = layout->original_type;
	parse_struct(&type, (type_parser)layout_structure_callback, layout);
	//printf("Calculated: (%s) %s %d %d\n", layout->original_type, layout->type, layout->record_size, layout->record_align);
	//printf("old start %s, new start %s\n", end, layout->type);
	return layout->type != end;
}